

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O0

SimComponent * __thiscall lsim::Simulator::create_component(Simulator *this,ModelComponent *desc)

{
  pointer pSVar1;
  bool bVar2;
  ComponentType CVar3;
  size_type sVar4;
  value_type_conflict local_50 [3];
  pointer local_38;
  pointer result;
  Simulator *local_28;
  unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_> local_20;
  __single_object sim_comp;
  ModelComponent *desc_local;
  Simulator *this_local;
  
  local_28 = this;
  sim_comp._M_t.super___uniq_ptr_impl<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>.
  _M_t.super__Tuple_impl<0UL,_lsim::SimComponent_*,_std::default_delete<lsim::SimComponent>_>.
  super__Head_base<0UL,_lsim::SimComponent_*,_false>._M_head_impl =
       (__uniq_ptr_data<lsim::SimComponent,_std::default_delete<lsim::SimComponent>,_true,_true>)
       (__uniq_ptr_data<lsim::SimComponent,_std::default_delete<lsim::SimComponent>,_true,_true>)
       desc;
  sVar4 = std::
          vector<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>,_std::allocator<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>_>_>
          ::size(&this->m_components);
  result._4_4_ = (undefined4)sVar4;
  std::make_unique<lsim::SimComponent,lsim::Simulator*,lsim::ModelComponent*&,unsigned_int>
            ((Simulator **)&local_20,(ModelComponent **)&local_28,(uint *)&sim_comp);
  local_38 = std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>::get
                       (&local_20);
  std::
  vector<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>,_std::allocator<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>_>_>
  ::push_back(&this->m_components,&local_20);
  local_50[0] = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (&this->m_input_changed,local_50);
  CVar3 = ModelComponent::type
                    ((ModelComponent *)
                     sim_comp._M_t.
                     super___uniq_ptr_impl<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_lsim::SimComponent_*,_std::default_delete<lsim::SimComponent>_>
                     .super__Head_base<0UL,_lsim::SimComponent_*,_false>._M_head_impl);
  bVar2 = component_has_function(this,CVar3,0);
  if (bVar2) {
    std::vector<lsim::SimComponent_*,_std::allocator<lsim::SimComponent_*>_>::push_back
              (&this->m_init_components,&local_38);
  }
  CVar3 = ModelComponent::type
                    ((ModelComponent *)
                     sim_comp._M_t.
                     super___uniq_ptr_impl<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_lsim::SimComponent_*,_std::default_delete<lsim::SimComponent>_>
                     .super__Head_base<0UL,_lsim::SimComponent_*,_false>._M_head_impl);
  bVar2 = component_has_function(this,CVar3,2);
  if (bVar2) {
    std::vector<lsim::SimComponent_*,_std::allocator<lsim::SimComponent_*>_>::push_back
              (&this->m_independent_components,&local_38);
  }
  pSVar1 = local_38;
  std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>::~unique_ptr
            (&local_20);
  return pSVar1;
}

Assistant:

SimComponent *Simulator::create_component(ModelComponent *desc) {
    auto sim_comp = std::make_unique<SimComponent>(this, desc, static_cast<uint32_t> (m_components.size()));
    auto result = sim_comp.get();

    m_components.push_back(std::move(sim_comp));
	m_input_changed.push_back(0);

    if (component_has_function(desc->type(), SIM_FUNCTION_SETUP)) {
        m_init_components.push_back(result);       
    }

    if (component_has_function(desc->type(), SIM_FUNCTION_INDEPENDENT)) {
        m_independent_components.push_back(result);
    }

    return result;
}